

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  byte bVar1;
  byte bVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  pointer pbVar5;
  pointer pbVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  code *pcVar11;
  iterator iVar12;
  mapped_type_conflict *pmVar13;
  long lVar14;
  long *plVar15;
  undefined8 uVar16;
  long *plVar17;
  mapped_type_conflict mVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  anon_struct_12_3_a9df7b98 *paVar19;
  ulong uVar20;
  ulong uVar21;
  byte *pbVar22;
  byte *pbVar23;
  pointer pbVar24;
  string namebuf;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  string linebuf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> materials;
  index_t idx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  stringstream errss;
  key_type local_4b0;
  void *local_490;
  string *local_488;
  allocator local_479;
  pointer local_478;
  pointer local_470;
  ios_base *local_468;
  string *local_460;
  anon_struct_12_3_a9df7b98 *local_458;
  iterator iStack_450;
  anon_struct_12_3_a9df7b98 *local_448;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  long *local_3f8;
  long local_3f0;
  long local_3e8;
  long lStack_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  MaterialReader *local_3c0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_3b8;
  vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> local_398;
  pointer local_378;
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360 [7];
  ios_base local_2f0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1e8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_490 = user_data;
  local_488 = warn;
  local_460 = err;
  local_3c0 = readMatFn;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448 = (anon_struct_12_3_a9df7b98 *)0x0;
  local_458 = (anon_struct_12_3_a9df7b98 *)0x0;
  iStack_450._M_current = (anon_struct_12_3_a9df7b98 *)0x0;
  local_398.super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_3d8,2);
  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  local_438._M_string_length = 0;
  local_438.field_2._M_local_buf[0] = '\0';
  local_468 = local_2f0;
LAB_00220e0d:
  do {
    iVar7 = std::istream::peek();
    if (iVar7 == -1) {
      if (local_460 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)local_460,local_370._0_8_);
        if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
          operator_delete((void *)local_370._0_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      if ((anon_struct_12_3_a9df7b98 *)
          local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (anon_struct_12_3_a9df7b98 *)0x0) {
        operator_delete(local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3d8);
      std::vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>::~vector(&local_398);
      if (local_458 != (anon_struct_12_3_a9df7b98 *)0x0) {
        operator_delete(local_458);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&local_1e8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return true;
    }
    safeGetline(inStream,&local_438);
    _Var4._M_p = local_438._M_dataplus._M_p;
  } while (local_438._M_string_length == 0);
  if (local_438._M_dataplus._M_p[local_438._M_string_length - 1] == '\n') goto code_r0x00220e45;
  goto LAB_00220e61;
code_r0x00220e45:
  local_438._M_string_length = local_438._M_string_length - 1;
  local_438._M_dataplus._M_p[local_438._M_string_length] = '\0';
  if (local_438._M_string_length == 0) goto LAB_00220e0d;
LAB_00220e61:
  if (local_438._M_dataplus._M_p[local_438._M_string_length - 1] == '\r') {
    local_438._M_string_length = local_438._M_string_length - 1;
    local_438._M_dataplus._M_p[local_438._M_string_length] = '\0';
    if (local_438._M_string_length == 0) goto LAB_00220e0d;
    sVar10 = strspn(local_438._M_dataplus._M_p," \t");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      __assert_fail("token",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/tinyobjloader/tiny_obj_loader.h"
                    ,0xa9b,
                    "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                   );
    }
  }
  else {
    sVar10 = strspn(local_438._M_dataplus._M_p," \t");
  }
  pbVar22 = (byte *)(_Var4._M_p + sVar10);
  bVar1 = *pbVar22;
  if (bVar1 < 0x66) {
    if ((bVar1 == 0) || (bVar1 == 0x23)) goto LAB_00220e0d;
  }
  else if (bVar1 == 0x66) {
    if ((pbVar22[1] == 0x20) || (pbVar22[1] == 9)) {
      sVar10 = strspn((char *)(pbVar22 + 2)," \t");
      if (iStack_450._M_current != local_458) {
        iStack_450._M_current = local_458;
      }
      pbVar22 = pbVar22 + sVar10 + 2;
      while ((0xd < *pbVar22 || ((0x2401U >> (*pbVar22 & 0x1f) & 1) == 0))) {
        iVar8 = atoi((char *)pbVar22);
        sVar10 = strcspn((char *)pbVar22,"/ \t\r");
        pbVar23 = pbVar22 + sVar10;
        iVar7 = 0;
        if (pbVar22[sVar10] == 0x2f) {
          if (pbVar23[1] == 0x2f) {
            pbVar23 = pbVar23 + 2;
            iVar9 = 0;
          }
          else {
            pbVar22 = pbVar23 + 1;
            iVar9 = atoi((char *)pbVar22);
            sVar10 = strcspn((char *)pbVar22,"/ \t\r");
            pbVar23 = pbVar22 + sVar10;
            if (pbVar22[sVar10] != 0x2f) goto LAB_0022117b;
            pbVar23 = pbVar23 + 1;
          }
          iVar7 = atoi((char *)pbVar23);
          sVar10 = strcspn((char *)pbVar23,"/ \t\r");
          pbVar23 = pbVar23 + sVar10;
        }
        else {
          iVar9 = 0;
          iVar7 = 0;
        }
LAB_0022117b:
        local_370._4_4_ = iVar7;
        local_370._0_4_ = iVar8;
        local_370._8_4_ = iVar9;
        if (iStack_450._M_current == local_448) {
          std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
          _M_realloc_insert<tinyobj::index_t_const&>
                    ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&local_458,
                     iStack_450,(anon_struct_12_3_a9df7b98 *)local_370);
        }
        else {
          (iStack_450._M_current)->texcoord_index = iVar9;
          (iStack_450._M_current)->vertex_index = iVar8;
          (iStack_450._M_current)->normal_index = iVar7;
          iStack_450._M_current = iStack_450._M_current + 1;
        }
        sVar10 = strspn((char *)pbVar23," \t\r");
        pbVar22 = pbVar23 + sVar10;
      }
      pcVar11 = *(code **)(callback + 0x18);
      if ((pcVar11 == (code *)0x0) || ((long)iStack_450._M_current - (long)local_458 == 0))
      goto LAB_00220e0d;
      uVar20 = ((long)iStack_450._M_current - (long)local_458 >> 2) * -0x5555555555555555;
      paVar19 = local_458;
      goto LAB_00221225;
    }
  }
  else if (bVar1 == 0x76) {
    bVar2 = pbVar22[1];
    if (bVar2 < 0x6e) {
      if ((bVar2 == 9) || (bVar2 == 0x20)) {
        sVar10 = strspn((char *)(pbVar22 + 2)," \t");
        pbVar22 = pbVar22 + sVar10 + 2;
        sVar10 = strcspn((char *)pbVar22," \t\r");
        pbVar23 = pbVar22 + sVar10;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar22,(char *)pbVar23,(double *)local_370);
        local_470 = (pointer)local_370._0_8_;
        sVar10 = strspn((char *)pbVar23," \t");
        pbVar23 = pbVar23 + sVar10;
        sVar10 = strcspn((char *)pbVar23," \t\r");
        pbVar22 = pbVar23 + sVar10;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar23,(char *)pbVar22,(double *)local_370);
        local_478 = (pointer)local_370._0_8_;
        sVar10 = strspn((char *)pbVar22," \t");
        pbVar22 = pbVar22 + sVar10;
        sVar10 = strcspn((char *)pbVar22," \t\r");
        pbVar23 = pbVar22 + sVar10;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar22,(char *)pbVar23,(double *)local_370);
        local_378 = (pointer)local_370._0_8_;
        sVar10 = strspn((char *)pbVar23," \t");
        pbVar23 = pbVar23 + sVar10;
        sVar10 = strcspn((char *)pbVar23," \t\r");
        local_370._0_8_ = (pointer)0x3ff0000000000000;
        tryParseDouble((char *)pbVar23,(char *)(pbVar23 + sVar10),(double *)local_370);
        if (*(code **)callback != (code *)0x0) {
          (**(code **)callback)
                    ((float)(double)local_470,(float)(double)local_478,(float)(double)local_378,
                     (float)(double)local_370._0_8_,local_490);
        }
        goto LAB_00220e0d;
      }
    }
    else if (bVar2 == 0x6e) {
      if ((pbVar22[2] == 0x20) || (pbVar22[2] == 9)) {
        sVar10 = strspn((char *)(pbVar22 + 3)," \t");
        pbVar22 = pbVar22 + sVar10 + 3;
        sVar10 = strcspn((char *)pbVar22," \t\r");
        pbVar23 = pbVar22 + sVar10;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar22,(char *)pbVar23,(double *)local_370);
        local_470 = (pointer)local_370._0_8_;
        sVar10 = strspn((char *)pbVar23," \t");
        pbVar23 = pbVar23 + sVar10;
        sVar10 = strcspn((char *)pbVar23," \t\r");
        pbVar22 = pbVar23 + sVar10;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar23,(char *)pbVar22,(double *)local_370);
        local_478 = (pointer)local_370._0_8_;
        sVar10 = strspn((char *)pbVar22," \t");
        pbVar22 = pbVar22 + sVar10;
        sVar10 = strcspn((char *)pbVar22," \t\r");
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar22,(char *)(pbVar22 + sVar10),(double *)local_370);
        if (*(code **)(callback + 8) != (code *)0x0) {
          (**(code **)(callback + 8))
                    ((float)(double)local_470,(float)(double)local_478,
                     (float)(double)local_370._0_8_,local_490);
        }
        goto LAB_00220e0d;
      }
    }
    else if ((bVar2 == 0x74) && ((pbVar22[2] == 0x20 || (pbVar22[2] == 9)))) {
      sVar10 = strspn((char *)(pbVar22 + 3)," \t");
      pbVar22 = pbVar22 + sVar10 + 3;
      sVar10 = strcspn((char *)pbVar22," \t\r");
      pbVar23 = pbVar22 + sVar10;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar22,(char *)pbVar23,(double *)local_370);
      local_470 = (pointer)local_370._0_8_;
      sVar10 = strspn((char *)pbVar23," \t");
      pbVar23 = pbVar23 + sVar10;
      sVar10 = strcspn((char *)pbVar23," \t\r");
      pbVar22 = pbVar23 + sVar10;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar23,(char *)pbVar22,(double *)local_370);
      local_478 = (pointer)local_370._0_8_;
      sVar10 = strspn((char *)pbVar22," \t");
      pbVar22 = pbVar22 + sVar10;
      sVar10 = strcspn((char *)pbVar22," \t\r");
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar22,(char *)(pbVar22 + sVar10),(double *)local_370);
      if (*(code **)(callback + 0x10) != (code *)0x0) {
        (**(code **)(callback + 0x10))
                  ((float)(double)local_470,(float)(double)local_478,(float)(double)local_370._0_8_,
                   local_490);
      }
      goto LAB_00220e0d;
    }
  }
  iVar7 = strncmp((char *)pbVar22,"usemtl",6);
  if ((iVar7 != 0) || ((pbVar22[6] != 0x20 && (pbVar22[6] != 9)))) {
    iVar7 = strncmp((char *)pbVar22,"mtllib",6);
    pbVar6 = local_3d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = local_3d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((iVar7 == 0) && ((pbVar22[6] == 0x20 || (pbVar22[6] == 9)))) {
      if (local_3c0 != (MaterialReader *)0x0) {
        local_418._M_dataplus._M_p = (pointer)0x0;
        local_418._M_string_length = 0;
        local_418.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string
                  ((string *)local_370,(char *)(pbVar22 + 7),(allocator *)&local_4b0);
        SplitString((string *)local_370,(char)&local_418,elems);
        if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
          operator_delete((void *)local_370._0_8_);
        }
        if (local_418._M_dataplus._M_p == (pointer)local_418._M_string_length) {
          if (local_488 != (string *)0x0) {
            std::__cxx11::string::append((char *)local_488);
          }
        }
        else {
          lVar14 = 0;
          uVar20 = 0;
          do {
            local_370._0_8_ = local_370 + 0x10;
            local_370._8_8_ = 0;
            local_360[0]._M_local_buf[0] = '\0';
            local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
            local_4b0._M_string_length = 0;
            local_4b0.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::string
                      ((string *)&local_3f8,*(char **)(local_418._M_dataplus._M_p + lVar14),
                       &local_479);
            iVar7 = (*local_3c0->_vptr_MaterialReader[2])
                              (local_3c0,(string *)&local_3f8,&local_398,&local_1e8,local_370,
                               &local_4b0);
            if (local_3f8 != &local_3e8) {
              operator_delete(local_3f8);
            }
            if ((local_488 != (string *)0x0) && (local_370._8_8_ != 0)) {
              std::__cxx11::string::_M_append((char *)local_488,local_370._0_8_);
            }
            if ((local_460 != (string *)0x0) && (local_4b0._M_string_length != 0)) {
              std::__cxx11::string::_M_append((char *)local_460,(ulong)local_4b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
              operator_delete(local_4b0._M_dataplus._M_p);
            }
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_);
            }
            if ((char)iVar7 != '\0') {
              if (*(code **)(callback + 0x28) == (code *)0x0) goto LAB_00221ac3;
              if (local_398.
                  super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_398.
                  super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>.
                  _M_impl.super__Vector_impl_data._M_start) goto LAB_00221cd7;
              (**(code **)(callback + 0x28))
                        (local_490,
                         local_398.
                         super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)local_398.
                                super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_398.
                                super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x63fb9aeb1fdcd759
                        );
              goto LAB_00221ac3;
            }
            uVar20 = uVar20 + 1;
            lVar14 = lVar14 + 0x20;
          } while (uVar20 < (ulong)((long)(local_418._M_string_length -
                                          (long)local_418._M_dataplus._M_p) >> 5));
          if (local_488 != (string *)0x0) {
            std::__cxx11::string::append((char *)local_488);
          }
        }
LAB_00221ac3:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_418);
      }
      goto LAB_00220e0d;
    }
    if (bVar1 != 0x6f) {
      if ((bVar1 != 0x67) || ((pbVar22[1] != 0x20 && (pbVar22[1] != 9)))) goto LAB_00220e0d;
      pbVar24 = local_3d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_3d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_3d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pcVar3 = (pbVar24->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &pbVar24->field_2) {
            operator_delete(pcVar3);
          }
          pbVar24 = pbVar24 + 1;
        } while (pbVar24 != pbVar6);
        local_3d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
      }
      while( true ) {
        if ((*pbVar22 < 0xe) && ((0x2401U >> (*pbVar22 & 0x1f) & 1) != 0)) break;
        local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
        local_4b0._M_string_length = 0;
        local_4b0.field_2._M_local_buf[0] = '\0';
        sVar10 = strspn((char *)pbVar22," \t");
        pbVar22 = pbVar22 + sVar10;
        sVar10 = strcspn((char *)pbVar22," \t\r");
        pbVar23 = pbVar22 + sVar10;
        local_370._0_8_ = local_370 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_370,pbVar22,pbVar23);
        std::__cxx11::string::operator=((string *)&local_4b0,(string *)local_370);
        if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
          operator_delete((void *)local_370._0_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_3d8,&local_4b0);
        sVar10 = strspn((char *)pbVar23," \t\r");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p);
        }
        pbVar22 = pbVar23 + sVar10;
      }
      if ((long)local_3d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_3d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
        __assert_fail("names.size() > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/tinyobjloader/tiny_obj_loader.h"
                      ,0xb39,
                      "bool tinyobj::LoadObjWithCallback(std::istream &, const callback_t &, void *, MaterialReader *, std::string *, std::string *)"
                     );
      }
      if (*(code **)(callback + 0x30) == (code *)0x0) goto LAB_00220e0d;
      uVar20 = (long)local_3d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar20 < 2) {
        (**(code **)(callback + 0x30))(local_490,0,0);
        goto LAB_00220e0d;
      }
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&local_3b8,uVar20 - 1);
      if (local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar20 = 0;
      }
      else {
        lVar14 = 0x20;
        uVar21 = 0;
        do {
          *(undefined8 *)
           ((int *)local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_start + uVar21 * 2) =
               *(undefined8 *)
                ((long)&((local_3d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar14);
          uVar21 = uVar21 + 1;
          uVar20 = (long)local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          lVar14 = lVar14 + 0x20;
        } while (uVar21 < uVar20);
      }
      if (local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                   uVar20);
LAB_00221cd7:
        uVar16 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        if ((anon_struct_12_3_a9df7b98 *)
            local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start != (anon_struct_12_3_a9df7b98 *)0x0) {
          operator_delete(local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3d8);
        std::vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>::~vector
                  (&local_398);
        if (local_458 != (anon_struct_12_3_a9df7b98 *)0x0) {
          operator_delete(local_458);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&local_1e8);
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar16);
      }
      pcVar11 = *(code **)(callback + 0x30);
      paVar19 = (anon_struct_12_3_a9df7b98 *)
                local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_00221225:
      (*pcVar11)(local_490,paVar19,uVar20);
      goto LAB_00220e0d;
    }
    if ((pbVar22[1] != 0x20) && (pbVar22[1] != 9)) goto LAB_00220e0d;
    std::__cxx11::stringstream::stringstream((stringstream *)local_370);
    sVar10 = strlen((char *)(pbVar22 + 2));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_370 + 0x10),(char *)(pbVar22 + 2),sVar10);
    std::__cxx11::stringbuf::str();
    if (*(code **)(callback + 0x38) != (code *)0x0) {
      (**(code **)(callback + 0x38))(local_490,local_4b0._M_dataplus._M_p);
    }
    goto LAB_00221b55;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_370);
  sVar10 = strlen((char *)(pbVar22 + 7));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_370 + 0x10),(char *)(pbVar22 + 7),sVar10);
  std::__cxx11::stringbuf::str();
  iVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&local_1e8,&local_4b0);
  if ((_Rb_tree_header *)iVar12._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
    pcVar11 = *(code **)(callback + 0x20);
    if (pcVar11 == (code *)0x0 && local_488 != (string *)0x0) {
      std::operator+(&local_418,"material [ ",&local_4b0);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_418);
      plVar17 = plVar15 + 2;
      if ((long *)*plVar15 == plVar17) {
        local_3e8 = *plVar17;
        lStack_3e0 = plVar15[3];
        local_3f8 = &local_3e8;
      }
      else {
        local_3e8 = *plVar17;
        local_3f8 = (long *)*plVar15;
      }
      local_3f0 = plVar15[1];
      *plVar15 = (long)plVar17;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_488,(ulong)local_3f8);
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      mVar18 = -1;
      goto LAB_00221b3c;
    }
    mVar18 = -1;
  }
  else {
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)&local_1e8,&local_4b0);
    mVar18 = *pmVar13;
LAB_00221b3c:
    pcVar11 = *(code **)(callback + 0x20);
  }
  if (pcVar11 != (code *)0x0) {
    (*pcVar11)(local_490,local_4b0._M_dataplus._M_p,mVar18);
  }
LAB_00221b55:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_370);
  std::ios_base::~ios_base(local_468);
  goto LAB_00220e0d;
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      if (material_map.find(namebuf) != material_map.end()) {
        newMaterialId = material_map[namebuf];
      } else {
        // { warn!! material not found }
        if (warn && (!callback.usemtl_cb)) {
          (*warn) += "material [ " + namebuf + " ] not found in .mtl\n";
        }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}